

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::CoreBroker(CoreBroker *this,string_view broker_name)

{
  (this->super_Broker)._vptr_Broker = (_func_int **)&PTR__Broker_004c93f0;
  BrokerBase::BrokerBase(&this->super_BrokerBase,broker_name,false);
  (this->super_Broker)._vptr_Broker = (_func_int **)&PTR__CoreBroker_004c9140;
  (this->super_BrokerBase)._vptr_BrokerBase = (_func_int **)&DAT_004c9290;
  *(undefined4 *)&(this->super_BrokerBase).field_0x292 = 0;
  (this->super_BrokerBase).field_0x296 = 0;
  this->routeCount = 1;
  gmlc::containers::
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  ::DualStringMappedVector(&this->mFederates);
  gmlc::containers::
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  ::DualStringMappedVector(&this->mBrokers);
  (this->mPreviousLocalBrokerIdentifier)._M_dataplus._M_p =
       (pointer)&(this->mPreviousLocalBrokerIdentifier).field_2;
  (this->mPreviousLocalBrokerIdentifier)._M_string_length = 0;
  (this->mPreviousLocalBrokerIdentifier).field_2._M_local_buf[0] = '\0';
  HandleManager::HandleManager(&this->handles);
  UnknownHandleManager::UnknownHandleManager(&this->unknownHandles);
  (this->delayedDependencies).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->delayedDependencies).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->delayedDependencies).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->global_id_translation)._M_h._M_buckets =
       &(this->global_id_translation)._M_h._M_single_bucket;
  (this->global_id_translation)._M_h._M_bucket_count = 1;
  (this->global_id_translation)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->global_id_translation)._M_h._M_element_count = 0;
  (this->global_id_translation)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->global_id_translation)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->global_id_translation)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->routing_table)._M_h._M_buckets = &(this->routing_table)._M_h._M_single_bucket;
  (this->routing_table)._M_h._M_bucket_count = 1;
  (this->routing_table)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->routing_table)._M_h._M_element_count = 0;
  (this->routing_table)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->routing_table)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->routing_table)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->knownExternalEndpoints)._M_h._M_buckets =
       &(this->knownExternalEndpoints)._M_h._M_single_bucket;
  (this->knownExternalEndpoints)._M_h._M_bucket_count = 1;
  (this->knownExternalEndpoints)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->knownExternalEndpoints)._M_h._M_element_count = 0;
  (this->knownExternalEndpoints)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->knownExternalEndpoints)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->knownExternalEndpoints)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->global_values)._M_h._M_buckets = &(this->global_values)._M_h._M_single_bucket;
  (this->global_values)._M_h._M_bucket_count = 1;
  (this->global_values)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->global_values)._M_h._M_element_count = 0;
  (this->global_values)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->global_values)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->global_values)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->renamers)._M_h._M_buckets = &(this->renamers)._M_h._M_single_bucket;
  (this->renamers)._M_h._M_bucket_count = 1;
  (this->renamers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->renamers)._M_h._M_element_count = 0;
  (this->renamers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined8 *)((long)&(this->name_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->name_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->name_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->name_mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->name_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->renamers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->renamers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->queryCounter).super___atomic_base<int>._M_i = 1;
  this->force_connection = false;
  gmlc::concurrency::
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  DelayedObjects(&this->activeQueries);
  (this->mapBuilders).
  super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mapBuilders).
  super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mapBuilders).
  super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ::_Deque_base((_Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                 *)&this->queryTimeouts);
  (this->earlyMessages).
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->earlyMessages).
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->earlyMessages).
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gmlc::concurrency::TriggerVariable::TriggerVariable(&this->disconnection,false);
  std::make_unique<helics::TimeoutMonitor>();
  (this->nextAirLock).super___atomic_base<unsigned_short>._M_i = 0;
  CLI::std::array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_3UL>::
  array(&this->dataAirlocks);
  (this->mTimeMonitorFederate)._M_dataplus._M_p = (pointer)&(this->mTimeMonitorFederate).field_2;
  (this->mTimeMonitorFederate)._M_string_length = 0;
  (this->mTimeMonitorFederate).field_2._M_local_buf[0] = '\0';
  (this->mTimeMonitorFederateId).gid = -2010000000;
  (this->mTimeMonitorLocalFederateId).gid = -2010000000;
  (this->mTimeMonitorPeriod).internalTimeCode = 0;
  (this->mTimeMonitorLastLogTime).internalTimeCode = -0x7fffffffffffffff;
  (this->mTimeMonitorCurrentTime).internalTimeCode = -0x7fffffffffffffff;
  (this->simTime).super___atomic_float<double>._M_fp = -98763.2;
  (this->mNextTimeBarrier).internalTimeCode = 0x7fffffffffffffff;
  (this->delayTransmitQueue).m_pushLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->delayTransmitQueue).m_pushLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->delayTransmitQueue).m_pushLock.super___mutex_base._M_mutex + 0x10) =
       0;
  (this->delayTransmitQueue).m_pushLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->delayTransmitQueue).m_pushLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->delayTransmitQueue).m_pullLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->delayTransmitQueue).m_pullLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->delayTransmitQueue).m_pullLock.super___mutex_base._M_mutex + 0x10) =
       0;
  (this->delayTransmitQueue).m_pullLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->delayTransmitQueue).m_pullLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->delayTransmitQueue).pushElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->delayTransmitQueue).pushElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->delayTransmitQueue).pushElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->delayTransmitQueue).pullElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->delayTransmitQueue).pullElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->delayTransmitQueue).pullElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->delayTransmitQueue).queueEmptyFlag._M_base._M_i = true;
  return;
}

Assistant:

CoreBroker::CoreBroker(std::string_view broker_name):
    BrokerBase(broker_name), timeoutMon(std::make_unique<TimeoutMonitor>())
{
}